

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlines.cpp
# Opt level: O0

void skiwi::inline_ieee754_fxasin(asmcode *code,compiler_options *param_2)

{
  operand local_c8 [2];
  operation local_c0 [2];
  operand local_b8 [2];
  operation local_b0 [2];
  operand local_a8;
  operation local_a4 [5];
  operand local_90 [2];
  operation local_88;
  operand local_84;
  operation local_80;
  operand local_7c [2];
  operation local_74;
  operand local_70 [2];
  operation local_68 [2];
  operand local_60 [2];
  operation local_58;
  operand local_54 [2];
  operation local_4c;
  uint64_t local_48;
  uint64_t header;
  operand local_38;
  operation local_34;
  operand local_30;
  operation local_2c [2];
  operand local_24 [2];
  operation local_1c;
  compiler_options *local_18;
  compiler_options *param_1_local;
  asmcode *code_local;
  
  local_1c = SAR;
  local_24[1] = 9;
  local_24[0] = NUMBER;
  local_2c[1] = 1;
  local_18 = param_2;
  param_1_local = (compiler_options *)code;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_1c,local_24 + 1,local_24,(int *)(local_2c + 1));
  local_2c[0] = PUSH;
  local_30 = RAX;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            ((asmcode *)param_1_local,local_2c,&local_30);
  local_34 = FILD;
  local_38 = MEM_RSP;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            ((asmcode *)param_1_local,&local_34,&local_38);
  header._4_4_ = 0x4a;
  header._0_4_ = 9;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            ((asmcode *)param_1_local,(operation *)((long)&header + 4),(operand *)&header);
  local_48 = make_block_header(1,T_FLONUM);
  local_4c = MOV;
  local_54[1] = 10;
  local_54[0] = RBP;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            ((asmcode *)param_1_local,&local_4c,local_54 + 1,local_54);
  local_58 = OR;
  local_60[1] = 10;
  local_60[0] = NUMBER;
  local_68[1] = 5;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            ((asmcode *)param_1_local,&local_58,local_60 + 1,local_60,(int *)(local_68 + 1));
  local_68[0] = MOV;
  local_70[1] = 9;
  local_70[0] = NUMBER;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long&>
            ((asmcode *)param_1_local,local_68,local_70 + 1,local_70,&local_48);
  local_74 = MOV;
  local_7c[1] = 0x20;
  local_7c[0] = RAX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            ((asmcode *)param_1_local,&local_74,local_7c + 1,local_7c);
  local_80 = FLD;
  local_84 = ST0;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            ((asmcode *)param_1_local,&local_80,&local_84);
  local_88 = FMUL;
  local_90[1] = 0x3a;
  local_90[0] = ST0;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            ((asmcode *)param_1_local,&local_88,local_90 + 1,local_90);
  local_a4[4] = 0x17;
  assembler::asmcode::add<assembler::asmcode::operation>((asmcode *)param_1_local,local_a4 + 4);
  local_a4[3] = 0x25;
  assembler::asmcode::add<assembler::asmcode::operation>((asmcode *)param_1_local,local_a4 + 3);
  local_a4[2] = 0x21;
  assembler::asmcode::add<assembler::asmcode::operation>((asmcode *)param_1_local,local_a4 + 2);
  local_a4[1] = 0x1d;
  assembler::asmcode::add<assembler::asmcode::operation>((asmcode *)param_1_local,local_a4 + 1);
  local_a4[0] = FSTP;
  local_a8 = MEM_RBP;
  local_b0[1] = 8;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand,int>
            ((asmcode *)param_1_local,local_a4,&local_a8,(int *)(local_b0 + 1));
  local_b0[0] = ADD;
  local_b8[1] = 0x10;
  local_b8[0] = NUMBER;
  local_c0[1] = 0x10;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            ((asmcode *)param_1_local,local_b0,local_b8 + 1,local_b8,(int *)(local_c0 + 1));
  local_c0[0] = MOV;
  local_c8[1] = 9;
  local_c8[0] = RBX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            ((asmcode *)param_1_local,local_c0,local_c8 + 1,local_c8);
  return;
}

Assistant:

void inline_ieee754_fxasin(ASM::asmcode& code, const compiler_options&)
  {
  code.add(ASM::asmcode::SAR, ASM::asmcode::RAX, ASM::asmcode::NUMBER, 1);
  code.add(ASM::asmcode::PUSH, ASM::asmcode::RAX);
  code.add(ASM::asmcode::FILD, ASM::asmcode::MEM_RSP);
  code.add(ASM::asmcode::POP, ASM::asmcode::RAX);

  uint64_t header = make_block_header(1, T_FLONUM);
  code.add(ASM::asmcode::MOV, ASM::asmcode::RBX, ALLOC);
  code.add(ASM::asmcode::OR, ASM::asmcode::RBX, ASM::asmcode::NUMBER, block_tag);
  code.add(ASM::asmcode::MOV, ASM::asmcode::RAX, ASM::asmcode::NUMBER, header);
  code.add(ASM::asmcode::MOV, MEM_ALLOC, ASM::asmcode::RAX);

  code.add(ASM::asmcode::FLD, ASM::asmcode::ST0);
  code.add(ASM::asmcode::FMUL, ASM::asmcode::ST0, ASM::asmcode::ST0);
  code.add(ASM::asmcode::FLD1);
  code.add(ASM::asmcode::FSUBRP);
  code.add(ASM::asmcode::FSQRT);
  code.add(ASM::asmcode::FPATAN);
  code.add(ASM::asmcode::FSTP, MEM_ALLOC, CELLS(1));
  code.add(ASM::asmcode::ADD, ALLOC, ASM::asmcode::NUMBER, CELLS(2));
  code.add(ASM::asmcode::MOV, ASM::asmcode::RAX, ASM::asmcode::RBX);
  }